

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall JSONTest_Stringify_Test::TestBody(JSONTest_Stringify_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_210;
  Message local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar;
  stringstream ss;
  undefined1 local_1c0 [392];
  undefined1 local_38 [8];
  Value value;
  char *copy;
  char *input;
  JSONTest_Stringify_Test *this_local;
  
  copy = "[\"hello\",\"world\"]";
  input = (char *)this;
  value.field_1.str.str._M_str = strdup("[\"hello\",\"world\"]");
  json::Value::Value((Value *)local_38);
  json::Value::parse((Value *)local_38,value.field_1.str.str._M_str,ASCII);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar.message_);
  json::Value::stringify((ostream *)local_38,SUB81(local_1c0,0));
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
            ((EqHelper *)local_1e0,"ss.str()","input",&local_200,&copy);
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/json.cpp"
               ,0xe,message);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  free(value.field_1.str.str._M_str);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar.message_);
  json::Value::~Value((Value *)local_38);
  return;
}

Assistant:

TEST_F(JSONTest, Stringify) {
  // TODO: change the API to not require a copy
  auto input = "[\"hello\",\"world\"]";
  auto* copy = strdup(input);
  json::Value value;
  value.parse(copy, json::Value::ASCII);
  std::stringstream ss;
  value.stringify(ss);
  EXPECT_EQ(ss.str(), input);
  free(copy);
}